

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O2

void __thiscall CChromeTracer::addStartTimeMetadata(CChromeTracer *this,uint64_t startTime)

{
  ostream *poVar1;
  
  std::mutex::lock(&this->m_Mutex);
  poVar1 = std::operator<<((ostream *)&this->m_TraceFile,
                           "{\"ph\":\"M\",\"name\":\"clintercept_start_time\",\"pid\":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",\"tid\":0");
  poVar1 = std::operator<<(poVar1,",\"args\":{\"start_time\":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"}},\n");
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void addStartTimeMetadata(
            uint64_t startTime )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"clintercept_start_time\",\"pid\":" << m_ProcessId
            << ",\"tid\":0"
            << ",\"args\":{\"start_time\":" << startTime
            << "}},\n";
    }